

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O0

ares_conn_err_t
ares_socket_recv(ares_channel_t *channel,ares_socket_t s,ares_bool_t is_tcp,void *data,
                size_t data_len,size_t *read_bytes)

{
  size_t sVar1;
  int *piVar2;
  ares_ssize_t rv;
  size_t *read_bytes_local;
  size_t data_len_local;
  void *data_local;
  ares_bool_t is_tcp_local;
  ares_socket_t s_local;
  ares_channel_t *channel_local;
  
  *read_bytes = 0;
  sVar1 = (*(channel->sock_funcs).arecvfrom)
                    (s,data,data_len,0,(sockaddr *)0x0,(ares_socklen_t *)0x0,
                     channel->sock_func_cb_data);
  if ((long)sVar1 < 1) {
    if (sVar1 == 0) {
      if (is_tcp == ARES_FALSE) {
        channel_local._4_4_ = ARES_CONN_ERR_SUCCESS;
      }
      else {
        channel_local._4_4_ = ARES_CONN_ERR_CONNCLOSED;
      }
    }
    else {
      piVar2 = __errno_location();
      channel_local._4_4_ = ares_socket_deref_error(*piVar2);
    }
  }
  else {
    *read_bytes = sVar1;
    channel_local._4_4_ = ARES_CONN_ERR_SUCCESS;
  }
  return channel_local._4_4_;
}

Assistant:

ares_conn_err_t ares_socket_recv(ares_channel_t *channel, ares_socket_t s,
                                 ares_bool_t is_tcp, void *data,
                                 size_t data_len, size_t *read_bytes)
{
  ares_ssize_t rv;

  *read_bytes = 0;

  rv = channel->sock_funcs.arecvfrom(s, data, data_len, 0, NULL, 0,
                                     channel->sock_func_cb_data);

  if (rv > 0) {
    *read_bytes = (size_t)rv;
    return ARES_CONN_ERR_SUCCESS;
  }

  if (rv == 0) {
    /* UDP allows 0-byte packets and is connectionless, so this is success */
    if (!is_tcp) {
      return ARES_CONN_ERR_SUCCESS;
    } else {
      return ARES_CONN_ERR_CONNCLOSED;
    }
  }

  /* If we're here, rv<0 */
  return ares_socket_deref_error(SOCKERRNO);
}